

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bra86.c
# Opt level: O1

SizeT x86_Convert(Byte *data,SizeT size,UInt32 ip,UInt32 *state,int encoding)

{
  byte bVar1;
  byte *pbVar2;
  SizeT in_RAX;
  sbyte sVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  byte *pbVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  SizeT SVar12;
  SizeT SVar13;
  int iVar14;
  bool bVar15;
  
  if (size < 5) {
    return 0;
  }
  uVar9 = *state & 7;
  pbVar11 = data + (size - 4);
  SVar13 = 0;
  do {
    pbVar8 = data + SVar13;
    bVar15 = pbVar8 < pbVar11;
    if ((bVar15) && ((*pbVar8 & 0xfe) != 0xe8)) {
      lVar6 = (size - 5) - SVar13;
      pbVar2 = data + SVar13 + 1;
      do {
        pbVar7 = pbVar2;
        pbVar8 = pbVar11;
        if (lVar6 == 0) break;
        lVar6 = lVar6 + -1;
        pbVar8 = pbVar7;
        pbVar2 = pbVar7 + 1;
      } while ((*pbVar7 & 0xfe) != 0xe8);
      bVar15 = pbVar7 < pbVar11;
    }
    SVar12 = (long)pbVar8 - (long)data;
    uVar4 = SVar12 - SVar13;
    if (bVar15) {
      bVar15 = true;
      iVar5 = 0;
      if ((uVar4 < 3) && (bVar1 = (byte)uVar4 & 0x1f, uVar10 = uVar9 >> bVar1, uVar9 >> bVar1 != 0))
      {
        if ((uVar10 == 3 || 4 < uVar10) ||
           (uVar9 = uVar10, (byte)(pbVar8[(ulong)(uVar10 >> 1) + 1] + 1) < 2)) {
          uVar9 = uVar10 >> 1 | 4;
          SVar12 = SVar12 + 1;
          iVar5 = 3;
          bVar15 = false;
        }
      }
      else {
        uVar9 = 0;
      }
    }
    else {
      uVar10 = uVar9 >> ((byte)uVar4 & 0x1f);
      bVar15 = false;
      if (2 < uVar4) {
        uVar10 = 0;
      }
      *state = uVar10;
      iVar5 = 1;
      in_RAX = SVar12;
    }
    SVar13 = SVar12;
    if (bVar15) {
      if ((pbVar8[4] + 1 & 0xfe) == 0) {
        iVar14 = ip + 5 + (int)SVar12;
        iVar5 = -iVar14;
        if (encoding != 0) {
          iVar5 = iVar14;
        }
        uVar10 = iVar5 + ((uint)pbVar8[1] |
                         (uint)pbVar8[2] << 8 | (uint)pbVar8[3] << 0x10 | (uint)pbVar8[4] << 0x18);
        if ((uVar9 != 0) && (sVar3 = (sbyte)((uVar9 & 6) << 2), ((uVar10 >> sVar3) + 1 & 0xfe) == 0)
           ) {
          uVar10 = uVar10 ^ (0x100 << sVar3) - 1U;
          if (encoding == 0) {
            uVar10 = uVar10 - iVar14;
          }
          else {
            uVar10 = uVar10 + iVar14;
          }
        }
        SVar13 = SVar12 + 5;
        pbVar8[1] = (byte)uVar10;
        pbVar8[2] = (byte)(uVar10 >> 8);
        pbVar8[3] = (byte)(uVar10 >> 0x10);
        pbVar8[4] = (byte)((int)(uVar10 << 7) >> 0x1f);
        uVar9 = 0;
      }
      else {
        uVar9 = uVar9 >> 1 | 4;
        SVar13 = SVar12 + 1;
      }
      iVar5 = 0;
    }
    if ((iVar5 != 0) && (iVar5 != 3)) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

SizeT x86_Convert(Byte *data, SizeT size, UInt32 ip, UInt32 *state, int encoding)
{
  SizeT pos = 0;
  UInt32 mask = *state & 7;
  if (size < 5)
    return 0;
  size -= 4;
  ip += 5;

  for (;;)
  {
    Byte *p = data + pos;
    const Byte *limit = data + size;
    for (; p < limit; p++)
      if ((*p & 0xFE) == 0xE8)
        break;

    {
      SizeT d = (SizeT)(p - data - pos);
      pos = (SizeT)(p - data);
      if (p >= limit)
      {
        *state = (d > 2 ? 0 : mask >> (unsigned)d);
        return pos;
      }
      if (d > 2)
        mask = 0;
      else
      {
        mask >>= (unsigned)d;
        if (mask != 0 && (mask > 4 || mask == 3 || Test86MSByte(p[(mask >> 1) + 1])))
        {
          mask = (mask >> 1) | 4;
          pos++;
          continue;
        }
      }
    }

    if (Test86MSByte(p[4]))
    {
      UInt32 v = ((UInt32)p[4] << 24) | ((UInt32)p[3] << 16) | ((UInt32)p[2] << 8) | ((UInt32)p[1]);
      UInt32 cur = ip + (UInt32)pos;
      pos += 5;
      if (encoding)
        v += cur;
      else
        v -= cur;
      if (mask != 0)
      {
        unsigned sh = (mask & 6) << 2;
        if (Test86MSByte((Byte)(v >> sh)))
        {
          v ^= (((UInt32)0x100 << sh) - 1);
          if (encoding)
            v += cur;
          else
            v -= cur;
        }
        mask = 0;
      }
      p[1] = (Byte)v;
      p[2] = (Byte)(v >> 8);
      p[3] = (Byte)(v >> 16);
      p[4] = (Byte)(0 - ((v >> 24) & 1));
    }
    else
    {
      mask = (mask >> 1) | 4;
      pos++;
    }
  }
}